

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMU_SENSITIVE_COMPOSITE_Unmarshal
                 (TPMU_SENSITIVE_COMPOSITE *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  uint uVar4;
  
  if ((int)selector < 0x23) {
    if (selector == 1) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x81) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)target + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
    if (selector == 8) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x85) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)target + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
  }
  else {
    if (selector == 0x23) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x21) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)target + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
    if (selector == 0x25) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x21) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)target + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
  }
  return 0x98;
}

Assistant:

TPM_RC
TPMU_SENSITIVE_COMPOSITE_Unmarshal(TPMU_SENSITIVE_COMPOSITE *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Unmarshal((TPM2B_PRIVATE_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Unmarshal((TPM2B_SENSITIVE_DATA *)&(target->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Unmarshal((TPM2B_SYM_KEY *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return TPM_RC_SELECTOR;
}